

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O2

Mat * ssd(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  int y;
  int iVar5;
  int iVar6;
  size_type __n;
  ulong uVar7;
  ulong uVar8;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar9;
  long lVar10;
  long lVar11;
  char in_R8B;
  int i;
  pointer pvVar12;
  int j;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  Mat local_230 [8];
  Mat depth;
  long local_220;
  long *local_1e8;
  Mat local_1d0 [8];
  Mat left;
  long local_1c0;
  long *local_188;
  Mat local_170 [8];
  Mat right;
  long local_160;
  long *local_128;
  undefined1 local_110 [8];
  vector<int,_std::allocator<int>_> tmp;
  long *local_c8;
  undefined1 auStack_98 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  min_ssd;
  long local_68;
  value_type_conflict local_60;
  int local_5c;
  int local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int local_38;
  allocator_type local_31;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(in_register_00000009,add_constant);
  uVar1 = **(uint **)(in2 + 0x40);
  local_48 = (ulong)uVar1;
  uVar2 = (*(uint **)(in2 + 0x40))[1];
  local_40 = (ulong)uVar2;
  cv::Mat::Mat(local_230,uVar1,uVar2,0);
  auStack_98 = (undefined1  [8])0x0;
  min_ssd.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_ssd.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bgr_to_grey(local_1d0);
  bgr_to_grey(local_170);
  if (in_R8B != '\0') {
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_110,10.0);
    cv::operator+=(local_170,(Scalar *)local_110);
  }
  __n = (size_type)(int)local_40;
  uVar15 = 0;
  if (0 < (int)local_48) {
    uVar15 = local_48 & 0xffffffff;
  }
  uVar7 = uVar15;
  while (iVar5 = (int)uVar7, uVar7 = (ulong)(iVar5 - 1), iVar5 != 0) {
    local_60 = 0x7fffffff;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_110,__n,&local_60,&local_31);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)auStack_98,(value_type *)local_110);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_110);
  }
  local_38 = (int)local_40;
  local_5c = local_38 + -1;
  local_68 = 0;
  uVar7 = 0;
  if (0 < local_38) {
    uVar7 = local_40 & 0xffffffff;
  }
  local_54 = (int)local_48 + -1;
  local_50 = 0;
  while( true ) {
    uVar16 = local_50;
    if ((int)local_50 < (int)local_40) {
      uVar16 = local_40;
    }
    if (local_50 == 0x50) break;
    cv::Mat::Mat((Mat *)local_110,(int)local_48,(int)local_40,0);
    bVar4 = std::operator==(__lhs,"left");
    if (bVar4) {
      for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
        for (uVar9 = 0; local_50 != uVar9; uVar9 = uVar9 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish + uVar9 + *local_c8 * uVar8) =
               *(undefined1 *)(uVar9 + *local_128 * uVar8 + local_160);
        }
        for (lVar10 = 0; (uVar16 & 0xffffffff) + local_68 != lVar10; lVar10 = lVar10 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish + lVar10 + local_50 + *local_c8 * uVar8) =
               *(undefined1 *)(lVar10 + *local_128 * uVar8 + local_160);
        }
      }
    }
    else {
      bVar4 = std::operator==(__lhs,"right");
      if (!bVar4) {
        cv::Mat::Mat(in1,0,0,0);
        cv::Mat::~Mat((Mat *)local_110);
LAB_00103bf5:
        cv::Mat::~Mat(local_170);
        cv::Mat::~Mat(local_1d0);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)auStack_98);
        cv::Mat::~Mat(local_230);
        return in1;
      }
      for (uVar16 = 0; uVar16 != uVar15; uVar16 = uVar16 + 1) {
        for (lVar10 = 0; lVar11 = (long)local_38, lVar10 < (long)(__n - local_50);
            lVar10 = lVar10 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish + lVar10 + *local_c8 * uVar16) =
               *(undefined1 *)(lVar10 + *local_188 * uVar16 + local_1c0 + local_50);
        }
        for (; lVar11 < (long)__n; lVar11 = lVar11 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish + lVar11 + *local_c8 * uVar16) =
               *(undefined1 *)(lVar11 + *local_188 * uVar16 + local_1c0);
        }
      }
    }
    local_58 = (int)local_50 * 3;
    uVar16 = 0;
    while( true ) {
      uVar8 = 3;
      if (3 < (int)uVar16) {
        uVar8 = uVar16;
      }
      if (uVar16 == uVar15) break;
      min_ssd.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((uVar8 & 0xffffffff) - 3);
      iVar5 = (int)uVar16 + 3;
      if (local_54 <= iVar5) {
        iVar5 = local_54;
      }
      uVar8 = 0;
      while( true ) {
        uVar9 = 3;
        if (3 < (int)uVar8) {
          uVar9 = uVar8;
        }
        if (uVar8 == uVar7) break;
        lVar10 = (uVar9 & 0xffffffff) - 3;
        iVar14 = (int)uVar8 + 3;
        if (local_5c <= iVar14) {
          iVar14 = local_5c;
        }
        bVar4 = std::operator==(__lhs,"left");
        if (bVar4) {
          iVar6 = 0;
          for (pvVar12 = min_ssd.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; lVar11 = lVar10,
              (long)pvVar12 <= (long)iVar5;
              pvVar12 = (pointer)((long)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start + 1)) {
            for (; lVar11 <= iVar14; lVar11 = lVar11 + 1) {
              iVar13 = (uint)*(byte *)(lVar11 + *local_188 * (long)pvVar12 + local_1c0) -
                       (uint)*(byte *)((long)tmp.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish +
                                      lVar11 + *local_c8 * (long)pvVar12);
              iVar6 = iVar6 + iVar13 * iVar13;
            }
          }
        }
        else {
          iVar6 = 0;
          for (pvVar12 = min_ssd.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; lVar11 = lVar10,
              (long)pvVar12 <= (long)iVar5;
              pvVar12 = (pointer)((long)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start + 1)) {
            for (; lVar11 <= iVar14; lVar11 = lVar11 + 1) {
              iVar13 = (uint)*(byte *)(lVar11 + *local_128 * (long)pvVar12 + local_160) -
                       (uint)*(byte *)((long)tmp.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish +
                                      lVar11 + *local_c8 * (long)pvVar12);
              iVar6 = iVar6 + iVar13 * iVar13;
            }
          }
        }
        piVar3 = (((pointer)((long)auStack_98 + uVar16 * 0x18))->
                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        if (iVar6 < piVar3[uVar8]) {
          piVar3[uVar8] = iVar6;
          *(char *)(uVar8 + *local_1e8 * uVar16 + local_220) = (char)local_58;
        }
        uVar8 = uVar8 + 1;
      }
      uVar16 = uVar16 + 1;
    }
    cv::Mat::~Mat((Mat *)local_110);
    local_50 = local_50 + 1;
    local_38 = local_38 + -1;
    local_68 = local_68 + -1;
  }
  cv::Mat::Mat(in1,local_230);
  goto LAB_00103bf5;
}

Assistant:

Mat
ssd(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat depth(height, width, 0);
    vector< vector<int> > min_ssd; // store min SSD values

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    for (int i = 0; i < height; ++i)
    {
        vector<int> tmp(width, numeric_limits<int>::max());
        min_ssd.push_back(tmp);
    }

    for (int offset = 0; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's SSD value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                int sum_sd = 0;

                if (type == "left")
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(left.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }
                else
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(right.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }

                // smaller SSD value found
                if (sum_sd < min_ssd[y][x])
                {
                    min_ssd[y][x] = sum_sd;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}